

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

bool __thiscall
DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount>::
Append<Memory::Recycler>
          (DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount> *this,
          Recycler *allocator,AsyncGeneratorRequest **data)

{
  DListNodeBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*> *pDVar1;
  anon_union_8_3_7fb8a913_for_next aVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  Recycler *this_00;
  undefined4 *puVar6;
  anon_union_8_3_7fb8a913_for_next *paVar7;
  undefined1 local_50 [8];
  TrackAllocData data_1;
  
  local_50 = (undefined1  [8])
             &DListNode<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest*>::typeinfo;
  data_1.typeinfo = (type_info *)0x0;
  data_1.plusSize = 0xffffffffffffffff;
  data_1.count = (size_t)anon_var_dwarf_277e3d;
  data_1.filename._0_4_ = 0xf0;
  this_00 = Memory::Recycler::TrackAllocInfo(allocator,(TrackAllocData *)local_50);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_00bb16f9;
    *puVar6 = 0;
  }
  paVar7 = (anon_union_8_3_7fb8a913_for_next *)
           Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                     (this_00,0x18);
  if (paVar7 == (anon_union_8_3_7fb8a913_for_next *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) {
LAB_00bb16f9:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  paVar7[2].base = (DListNodeBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*> *)*data;
  pDVar1 = (this->super_DListNodeBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*>).prev.
           base;
  paVar7[1].base = pDVar1;
  aVar2 = pDVar1->next;
  paVar7->base = (DListNodeBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*> *)aVar2;
  *(anon_union_8_3_7fb8a913_for_next **)((long)aVar2 + 8) = paVar7;
  (pDVar1->next).base =
       (DListNodeBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*> *)paVar7;
  (this->super_RealCount).count = (this->super_RealCount).count + 1;
  return true;
}

Assistant:

bool Append(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            DListBase::InsertNodeAfter(this->Prev(), newNode);
            this->IncrementCount();
            return true;
        }
        return false;
    }